

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creation_set.c
# Opt level: O3

int cset_read_support_filter_program(creation_set *cset,archive *a)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = cset->filter_count;
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    lVar3 = 8;
    iVar2 = 0;
    do {
      if (*(int *)((long)cset->filters + lVar3 + -8) != 0) {
        archive_read_support_filter_program(a,*(char **)((long)&cset->filters->program + lVar3));
        iVar2 = iVar2 + 1;
        iVar1 = cset->filter_count;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < iVar1);
  }
  return iVar2;
}

Assistant:

int
cset_read_support_filter_program(struct creation_set *cset, struct archive *a)
{
	int cnt = 0, i;

	for (i = 0; i < cset->filter_count; i++) {
		if (cset->filters[i].program) {
			archive_read_support_filter_program(a,
			    cset->filters[i].filter_name);
			++cnt;
		}
	}
	return (cnt);
}